

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

void __thiscall flatbuffers::FlatBufferBuilderImpl<false>::Clear(FlatBufferBuilderImpl<false> *this)

{
  uint8_t *puVar1;
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  *this_00;
  uint8_t *puVar2;
  
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  puVar1 = (this->buf_).buf_;
  if (puVar1 == (uint8_t *)0x0) {
    (this->buf_).reserved_ = 0;
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = puVar1 + (this->buf_).reserved_;
  }
  (this->buf_).cur_ = puVar2;
  (this->buf_).size_ = 0;
  (this->buf_).scratch_ = puVar1;
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->length_of_64_bit_region_ = 0;
  this_00 = (_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
             *)this->string_pool;
  if (this_00 ==
      (_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
       *)0x0) {
    return;
  }
  std::
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  ::_M_erase(this_00,*(_Link_type *)(this_00 + 0x10));
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    **)(this_00 + 0x18) = this_00 + 8;
  *(_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    **)(this_00 + 0x20) = this_00 + 8;
  *(undefined8 *)(this_00 + 0x28) = 0;
  return;
}

Assistant:

void ClearOffsets() {
    buf_.scratch_pop(num_field_loc * sizeof(FieldLoc));
    num_field_loc = 0;
    max_voffset_ = 0;
  }